

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_qualities.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::filter_coarsen_min_qual
          (Omega_h *this,Read<signed_char> *cand_codes,Reals *cand_quals,Real min_qual)

{
  void *extraout_RDX;
  Read<signed_char> RVar1;
  Read<signed_char> local_78;
  Read<signed_char> local_68 [2];
  Read<double> local_48;
  undefined1 local_38 [8];
  Bytes keep_dirs;
  Real min_qual_local;
  Reals *cand_quals_local;
  Read<signed_char> *cand_codes_local;
  
  keep_dirs.write_.shared_alloc_.direct_ptr = (void *)min_qual;
  Read<double>::Read(&local_48,cand_quals);
  each_geq_to<double>((Omega_h *)local_38,&local_48,
                      (double)keep_dirs.write_.shared_alloc_.direct_ptr);
  Read<double>::~Read(&local_48);
  Read<signed_char>::Read(local_68,cand_codes);
  Read<signed_char>::Read(&local_78,(Read<signed_char> *)local_38);
  filter_coarsen_dirs(this,local_68,&local_78);
  Read<signed_char>::~Read(&local_78);
  Read<signed_char>::~Read(local_68);
  Read<signed_char>::~Read((Read<signed_char> *)local_38);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<I8> filter_coarsen_min_qual(
    Read<I8> cand_codes, Reals cand_quals, Real min_qual) {
  auto keep_dirs = each_geq_to(cand_quals, min_qual);
  return filter_coarsen_dirs(cand_codes, keep_dirs);
}